

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

void InitClassMap(FClassMap *themap,SpawnMap *thedata)

{
  uint uVar1;
  PClass *p;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  PClassActor *cls;
  FName local_3c;
  PClassActor *local_38;
  
  M_Free(themap->Nodes);
  themap->Nodes = (Node *)0x0;
  themap->LastFree = (Node *)0x0;
  themap->Size = 0;
  themap->NumUsed = 0;
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::SetNodeVector(themap,1);
  uVar1 = thedata->Size;
  if (uVar1 != 0) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 & 0xffffffff;
      piVar4 = &thedata->Nodes[uVar3].Pair.Value.linenum;
      while (*(long *)(piVar4 + -8) == 1) {
        uVar3 = uVar3 + 1;
        piVar4 = piVar4 + 10;
        if (uVar1 <= uVar3) goto LAB_0045bc6a;
      }
      local_38 = (PClassActor *)0x0;
      uVar1 = (((MapinfoSpawnItem *)(piVar4 + -4))->classname).Index;
      if (uVar1 == 0) {
        TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::DelKey
                  (themap,piVar4[-6]);
      }
      else {
        local_3c.Index = uVar1;
        p = PClass::FindClass(&local_3c);
        local_38 = dyn_cast<PClassActor>((DObject *)p);
        if (local_38 == (PClassActor *)0x0) {
          Printf("\x1cGScript error, \"%s\" line %d:\nUnknown actor class %s\n",
                 ((FString *)(piVar4 + -2))->Chars,(ulong)(uint)*piVar4,
                 FName::NameData.NameArray[(((MapinfoSpawnItem *)(piVar4 + -4))->classname).Index].
                 Text);
          uVar2 = uVar2 + 1;
        }
        TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Insert
                  (themap,piVar4[-6],&local_38);
      }
      uVar3 = uVar3 + 1;
      uVar1 = thedata->Size;
    } while ((uint)uVar3 < uVar1);
LAB_0045bc6a:
    if (0 < (int)uVar2) {
      I_Error("%d unknown actor classes found",(ulong)uVar2);
    }
  }
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::ClearNodeVector
            (thedata);
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::SetNodeVector
            (thedata,1);
  return;
}

Assistant:

void InitClassMap(FClassMap &themap, SpawnMap &thedata)
{
	themap.Clear();
	SpawnMap::Iterator it(thedata);
	SpawnMap::Pair *pair;
	int error = 0;

	while (it.NextPair(pair))
	{
		PClassActor *cls = NULL;
		if (pair->Value.classname != NAME_None)
		{
			cls = PClass::FindActor(pair->Value.classname);
			if (cls == NULL)
			{
				Printf(TEXTCOLOR_RED "Script error, \"%s\" line %d:\nUnknown actor class %s\n",
					pair->Value.filename.GetChars(), pair->Value.linenum, pair->Value.classname.GetChars());
				error++;
			}
			themap.Insert(pair->Key, cls);
		}
		else
		{
			themap.Remove(pair->Key);
		}
	}
	if (error > 0)
	{
		I_Error("%d unknown actor classes found", error);
	}
	thedata.Clear();	// we do not need this any longer
}